

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

bool __thiscall wallet::anon_unknown_5::WalletImpl::unlockCoin(WalletImpl *this,COutPoint *output)

{
  _Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_> _Var1;
  bool bVar2;
  tuple<wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_> batch_00;
  long in_FS_OFFSET;
  unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  __uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> local_40;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device =
       &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet).super_recursive_mutex;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  _Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
       (((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       m_database)._M_t.
       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
       _M_t.
       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>;
  if (_Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl ==
      (WalletDatabase *)0x0) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  batch_00.super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>.
  super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>)
       operator_new(0x10);
  (*(*(_func_int ***)_Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)[0xe]
  )(batch_00.
    super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>.
    super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl,
    _Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl,1);
  *(_Head_base<0UL,_wallet::WalletDatabase_*,_false> *)
   ((long)batch_00.
          super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>.
          super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl + 8) =
       _Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  local_40._M_t.
  super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>.
  super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl =
       (tuple<wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>)
       (tuple<wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>)
       batch_00.
       super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>.
       super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl;
  bVar2 = CWallet::UnlockCoin((this->m_wallet).
                              super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              ,output,(WalletBatch *)
                                      batch_00.
                                      super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>
                                      .super__Head_base<0UL,_wallet::WalletBatch_*,_false>.
                                      _M_head_impl);
  _GLOBAL__N_1::std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::
  ~unique_ptr((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *)
              &local_40);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool unlockCoin(const COutPoint& output) override
    {
        LOCK(m_wallet->cs_wallet);
        std::unique_ptr<WalletBatch> batch = std::make_unique<WalletBatch>(m_wallet->GetDatabase());
        return m_wallet->UnlockCoin(output, batch.get());
    }